

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.c
# Opt level: O0

void init_executor(pExecutor exec)

{
  undefined4 uVar1;
  pContext context;
  Expr EVar2;
  undefined4 uStack_64;
  undefined4 uStack_54;
  undefined4 uStack_44;
  undefined4 uStack_34;
  undefined4 uStack_24;
  pContext_conflict global;
  pExecutor exec_local;
  
  context = create_context();
  if (context == (pContext)0x0) {
    printf("init_executor: create_context failed\n");
    exit(1);
  }
  context_stack_push(exec->stack,context);
  exec->global = context;
  EVar2 = register_atom(exec,context,"nil",1);
  *(ulong *)&exec->nil = CONCAT44(uStack_24,EVar2.type);
  (exec->nil).field_1.val_atom = (size_t)EVar2.field_1;
  EVar2 = register_atom(exec,context,"t",1);
  *(ulong *)&exec->t = CONCAT44(uStack_34,EVar2.type);
  (exec->t).field_1.val_atom = (size_t)EVar2.field_1;
  EVar2 = register_atom(exec,context,"quote",0);
  *(ulong *)&exec->quote = CONCAT44(uStack_44,EVar2.type);
  (exec->quote).field_1.val_atom = (size_t)EVar2.field_1;
  EVar2 = register_atom(exec,context,"#:comma",0);
  *(ulong *)&exec->comma = CONCAT44(uStack_54,EVar2.type);
  (exec->comma).field_1.val_atom = (size_t)EVar2.field_1;
  EVar2 = register_atom(exec,context,"#:comma_atsign",0);
  *(ulong *)&exec->comma_atsign = CONCAT44(uStack_64,EVar2.type);
  (exec->comma_atsign).field_1.val_atom = (size_t)EVar2.field_1;
  uVar1 = *(undefined4 *)&(exec->nil).field_0x4;
  (exec->code).type = (exec->nil).type;
  *(undefined4 *)&(exec->code).field_0x4 = uVar1;
  (exec->code).field_1 = (exec->nil).field_1;
  register_function(exec,context,"def",def);
  register_function(exec,context,"set",set);
  register_function(exec,context,"defm",defm);
  register_function(exec,context,"setm",setm);
  register_function(exec,context,"getm",getm);
  register_function(exec,context,"set-head",set_head_builtin);
  register_function(exec,context,"set-tail",set_tail_builtin);
  register_function(exec,context,"lambda",lambda);
  register_function(exec,context,"eval",eval_builtin);
  register_function(exec,context,"cond",cond);
  register_function(exec,context,"let",let);
  register_function(exec,context,"error",error);
  register_function(exec,context,"block",block);
  register_function(exec,context,"quote",quote);
  register_function(exec,context,"cons",cons);
  register_function(exec,context,"head",head);
  register_function(exec,context,"tail",tail);
  register_function(exec,context,"gensym",gensym);
  register_function(exec,context,"backquote",backquote);
  register_function(exec,context,"macro",macro);
  register_function(exec,context,"macroexpand",macroexpand);
  register_function(exec,context,"gc-collect",gc_collect_builtin);
  register_function(exec,context,"eq",eq);
  register_function(exec,context,"and",and);
  register_function(exec,context,"or",or);
  register_function(exec,context,"not",not);
  register_function(exec,context,"xor",xor);
  register_function(exec,context,"+",sum_builtin);
  register_function(exec,context,"-",difference_builtin);
  register_function(exec,context,"*",product_builtin);
  register_function(exec,context,"/",quotient_builtin);
  register_function(exec,context,"%",remainder_builtin);
  register_function(exec,context,"<",less_builtin);
  register_function(exec,context,"<=",less_or_equals_builtin);
  register_function(exec,context,"==",num_equals_builtin);
  register_function(exec,context,">=",more_or_equals_builtin);
  register_function(exec,context,">",more_builtin);
  register_function(exec,context,"atom?",atom_p);
  register_function(exec,context,"pair?",pair_p);
  register_function(exec,context,"char?",char_p);
  register_function(exec,context,"int?",int_p);
  register_function(exec,context,"real?",real_p);
  register_function(exec,context,"string?",string_p);
  register_function(exec,context,"function?",function_p);
  register_function(exec,context,"macro?",macro_p);
  register_function(exec,context,"str-len",str_len);
  register_function(exec,context,"str-at",str_at);
  register_function(exec,context,"__str-from-list",str_from_list);
  register_function(exec,context,"__str-to-list",str_to_list);
  register_function(exec,context,"__str-repeat-char",str_repeat_char);
  register_function(exec,context,"__str-repeat-str",str_repeat_str);
  register_function(exec,context,"__str-cmp-sub",str_cmp_sub);
  register_function(exec,context,"__str-cat",str_cat);
  register_function(exec,context,"__str-ind",str_ind);
  register_function(exec,context,"__str-insert",str_insert);
  register_function(exec,context,"__str-sub",str_sub);
  register_function(exec,context,"__str-remove",str_remove);
  register_function(exec,context,"to-upper",to_upper);
  register_function(exec,context,"to-lower",to_lower);
  register_function(exec,context,"print",print);
  register_function(exec,context,"prints",prints);
  register_function(exec,context,"scanline",scanline);
  return;
}

Assistant:

void init_executor(pExecutor exec)
{
    // Create global
    pContext global = create_context();
    if (global == NULL)
    {
        log("init_executor: create_context failed");
        exit(1);
    }
    context_stack_push(exec->stack, global);
    exec->global = global;


    // Create minimal set of atoms
    exec->nil = register_atom(exec, global, "nil", 1);
    exec->t = register_atom(exec, global, "t", 1);
    exec->quote = register_atom(exec, global, "quote", 0);
    exec->comma = register_atom(exec, global, "#:comma", 0);
    exec->comma_atsign = register_atom(exec, global, "#:comma_atsign", 0);

    // Set code to empty list
    exec->code = exec->nil;

    // Register built-in function
    register_function(exec, global, "def", def);
    register_function(exec, global, "set", set);

    register_function(exec, global, "defm", defm);
    register_function(exec, global, "setm", setm);
    register_function(exec, global, "getm", getm);

    register_function(exec, global, "set-head", set_head_builtin);
    register_function(exec, global, "set-tail", set_tail_builtin);

    register_function(exec, global, "lambda", lambda);
    register_function(exec, global, "eval", eval_builtin);
    register_function(exec, global, "cond", cond);
    register_function(exec, global, "let", let);
    register_function(exec, global, "error", error);
    register_function(exec, global, "block", block);
    register_function(exec, global, "quote", quote);
    register_function(exec, global, "cons", cons);
    register_function(exec, global, "head", head);
    register_function(exec, global, "tail", tail);

    register_function(exec, global, "gensym", gensym);
    register_function(exec, global, "backquote", backquote);
    register_function(exec, global, "macro", macro);
    register_function(exec, global, "macroexpand", macroexpand);
    register_function(exec, global, "gc-collect", gc_collect_builtin);

    register_function(exec, global, "eq", eq);
    register_function(exec, global, "and", and);
    register_function(exec, global, "or", or);
    register_function(exec, global, "not", not);
    register_function(exec, global, "xor", xor);

    register_function(exec, global, "+", sum_builtin);
    register_function(exec, global, "-", difference_builtin);
    register_function(exec, global, "*", product_builtin);
    register_function(exec, global, "/", quotient_builtin);
    register_function(exec, global, "%", remainder_builtin);

    register_function(exec, global, "<", less_builtin);
    register_function(exec, global, "<=", less_or_equals_builtin);
    register_function(exec, global, "==", num_equals_builtin);
    register_function(exec, global, ">=", more_or_equals_builtin);
    register_function(exec, global, ">", more_builtin);
    // Predicates
    register_function(exec, global, "atom?", atom_p);
    register_function(exec, global, "pair?", pair_p);
    register_function(exec, global, "char?", char_p);
    register_function(exec, global, "int?", int_p);
    register_function(exec, global, "real?", real_p);
    register_function(exec, global, "string?", string_p);
    register_function(exec, global, "function?", function_p);
    register_function(exec, global, "macro?", macro_p);
    // Strings
    register_function(exec, global, "str-len", str_len);
    register_function(exec, global, "str-at", str_at);
    register_function(exec, global, "__str-from-list", str_from_list);
    register_function(exec, global, "__str-to-list", str_to_list);
    register_function(exec, global, "__str-repeat-char", str_repeat_char);
    register_function(exec, global, "__str-repeat-str", str_repeat_str);
    register_function(exec, global, "__str-cmp-sub", str_cmp_sub);
    register_function(exec, global, "__str-cat", str_cat);
    register_function(exec, global, "__str-ind", str_ind);
    register_function(exec, global, "__str-insert", str_insert);
    register_function(exec, global, "__str-sub", str_sub);
    register_function(exec, global, "__str-remove", str_remove);
    register_function(exec, global, "to-upper", to_upper);
    register_function(exec, global, "to-lower", to_lower);
    // IO
    register_function(exec, global, "print", print);
    register_function(exec, global, "prints", prints);
    register_function(exec, global, "scanline", scanline);
}